

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZDecomposed::ApplyStrainComputeElasticStress
          (TPZDecomposed *this,TPZTensor<TFad<6,_double>_> *Stress,REAL *K,REAL *G)

{
  TFad<6,_double> *pTVar1;
  TPZTensor<TFad<6,_double>_> SigVol;
  TFad<6,_double> local_358;
  TFad<6,_double> local_318;
  TFad<6,_double> local_2d8;
  TFad<6,_double> local_298;
  TPZTensor<TFad<6,_double>_> local_258;
  TFad<6,_double> local_b0;
  TFad<6,_double> local_70;
  
  TFad<6,_double>::TFad(&local_70,(this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore);
  TFad<6,_double>::TFad(&local_298,(this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore + 1);
  TFad<6,_double>::TFad(&local_2d8,(this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore + 2);
  local_258.super_TPZSavable._vptr_TPZSavable = (_func_int **)&local_318;
  local_318.super_TPZSavable._vptr_TPZSavable = (_func_int **)&local_70;
  local_318.val_ = (double)&local_298;
  local_258.fData.super_TPZVec<TFad<6,_double>_>._vptr_TPZVec = (_func_int **)&local_2d8;
  TFad<6,double>::
  TFad<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>
            ((TFad<6,double> *)&local_b0,
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
              *)&local_258);
  local_258.fData.super_TPZVec<TFad<6,_double>_>._vptr_TPZVec = (_func_int **)0x4008000000000000;
  local_258.super_TPZSavable._vptr_TPZSavable = (_func_int **)&local_b0;
  TFad<6,double>::TFad<TFadBinaryDiv<TFad<6,double>,TFadCst<double>>>
            (&local_318,(TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFadCst<double>_>_> *)&local_258);
  TPZTensor<TFad<6,_double>_>::TPZTensor(&local_258);
  local_358.super_TPZSavable._vptr_TPZSavable = (_func_int **)*K;
  local_358.val_ = (double)&local_b0;
  pTVar1 = TFad<6,double>::operator=
                     ((TFad<6,double> *)(local_258.fData.super_TPZVec<TFad<6,_double>_>.fStore + 5),
                      (TFadExpr<TFadBinaryMul<TFadCst<double>,_TFad<6,_double>_>_> *)&local_358);
  pTVar1 = TFad<6,_double>::operator=
                     (local_258.fData.super_TPZVec<TFad<6,_double>_>.fStore + 3,pTVar1);
  TFad<6,_double>::operator=(local_258.fData.super_TPZVec<TFad<6,_double>_>.fStore,pTVar1);
  local_358.super_TPZSavable._vptr_TPZSavable = (_func_int **)&local_70;
  local_358.val_ = (double)&local_318;
  TFad<6,double>::operator=
            ((TFad<6,double> *)(Stress->fData).super_TPZVec<TFad<6,_double>_>.fStore,
             (TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_358);
  local_358.super_TPZSavable._vptr_TPZSavable = (_func_int **)&local_298;
  local_358.val_ = (double)&local_318;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((Stress->fData).super_TPZVec<TFad<6,_double>_>.fStore + 3),
             (TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_358);
  local_358.super_TPZSavable._vptr_TPZSavable = (_func_int **)&local_2d8;
  local_358.val_ = (double)&local_318;
  TFad<6,double>::operator=
            ((TFad<6,double> *)((Stress->fData).super_TPZVec<TFad<6,_double>_>.fStore + 5),
             (TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_358);
  local_358.val_ = *G + *G;
  local_358.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_358.dx_[0] = 0.0;
  local_358.dx_[1] = 0.0;
  local_358.dx_[2] = 0.0;
  local_358.dx_[3] = 0.0;
  local_358.dx_[4] = 0.0;
  local_358.dx_[5] = 0.0;
  TPZTensor<TFad<6,_double>_>::operator*=(Stress,&local_358);
  TPZTensor<TFad<6,_double>_>::operator+=(Stress,&local_258);
  ~TPZTensor(&local_258);
  return;
}

Assistant:

void ApplyStrainComputeElasticStress(TPZTensor<T> &Stress, REAL &K, REAL & G) {
            const T sig1 = this->fEigenvalues[0];
            const T sig2 = this->fEigenvalues[1];
            const T sig3 = this->fEigenvalues[2];
            const T trace = sig1 + sig2 + sig3;
            const T trace_3 = trace / 3.;

            TPZTensor<T> SigVol;
            SigVol.XX() = SigVol.YY() = SigVol.ZZ() = K * trace;

            Stress.XX() = sig1 - trace_3;
            Stress.YY() = sig2 - trace_3;
            Stress.ZZ() = sig3 - trace_3;
            Stress *= (2 * G);
            Stress += SigVol;
        }